

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromiseresolver.h
# Opt level: O1

void __thiscall
QtPromisePrivate::PromiseResolver<QSharedPointer<Data>_>::PromiseResolver
          (PromiseResolver<QSharedPointer<Data>_> *this,QPromise<QSharedPointer<Data>_> *promise)

{
  Data *pDVar1;
  QPromise<QSharedPointer<Data>_> *pQVar2;
  
  pDVar1 = (Data *)operator_new(0x10);
  (pDVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> = (__atomic_base<int>)0x0;
  pDVar1->promise = (QPromise<QSharedPointer<Data>_> *)0x0;
  (this->m_d).d = pDVar1;
  LOCK();
  (pDVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pDVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  pQVar2 = (QPromise<QSharedPointer<Data>_> *)operator_new(0x10);
  (pQVar2->super_QPromiseBase<QSharedPointer<Data>_>)._vptr_QPromiseBase =
       (_func_int **)&PTR__QPromiseBase_00124580;
  (pQVar2->super_QPromiseBase<QSharedPointer<Data>_>).m_d.d =
       (PromiseData<QSharedPointer<Data>_> *)0x0;
  (pQVar2->super_QPromiseBase<QSharedPointer<Data>_>).m_d.d =
       (promise->super_QPromiseBase<QSharedPointer<Data>_>).m_d.d;
  (promise->super_QPromiseBase<QSharedPointer<Data>_>).m_d.d =
       (PromiseData<QSharedPointer<Data>_> *)0x0;
  (pQVar2->super_QPromiseBase<QSharedPointer<Data>_>)._vptr_QPromiseBase =
       (_func_int **)&PTR__QPromiseBase_00124990;
  ((this->m_d).d)->promise = pQVar2;
  return;
}

Assistant:

PromiseResolver(QtPromise::QPromise<T> promise) : m_d{new Data{}}
    {
        m_d->promise = new QtPromise::QPromise<T>{std::move(promise)};
    }